

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void nullcPrintAutoArrayInfo(char *ptr,uint indentDepth)

{
  void *ptr_00;
  char *pcVar1;
  ExternTypeInfo *pEVar2;
  void *pvVar3;
  uint uVar4;
  
  pcVar1 = nullcDebugSymbols((uint *)0x0);
  pEVar2 = nullcDebugTypeInfo((uint *)0x0);
  ptr_00 = (void *)**(undefined8 **)(ptr + 4);
  uVar4 = indentDepth;
  if (indentDepth == 0) {
    printf("typeid type = %d (%s)\n",(ulong)*(uint *)ptr,pcVar1 + pEVar2[*(uint *)ptr].offsetToName)
    ;
  }
  else {
    do {
      printf("  ");
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    printf("typeid type = %d (%s)\n",(ulong)*(uint *)ptr,pcVar1 + pEVar2[*(uint *)ptr].offsetToName)
    ;
    uVar4 = indentDepth;
    do {
      printf("  ");
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  printf("%s[] data = ",pcVar1 + pEVar2[*(uint *)ptr].offsetToName);
  pvVar3 = NULLC::GetBasePointer(ptr_00);
  if (pvVar3 == (void *)0x0) {
    printf("%p\n",ptr_00);
  }
  else {
    printf("%p [base %p, ",ptr_00,pvVar3);
    nullcPrintPointerMarkerInfo(*(markerType *)((long)pvVar3 + -8));
    puts("]");
  }
  if (indentDepth != 0) {
    do {
      printf("  ");
      indentDepth = indentDepth - 1;
    } while (indentDepth != 0);
  }
  printf("int len = %u\n",(ulong)*(uint *)(ptr + 0xc));
  return;
}

Assistant:

void nullcPrintAutoArrayInfo(char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);

	NULLCAutoArray *arr = (NULLCAutoArray*)ptr;

	void *target = *(void**)arr->ptr;

	nullcPrintDepthIndent(indentDepth);
	printf("typeid type = %d (%s)\n", arr->typeID, codeSymbols + codeTypes[arr->typeID].offsetToName);

	nullcPrintDepthIndent(indentDepth);
	printf("%s[] data = ", codeSymbols + codeTypes[arr->typeID].offsetToName);

	if(void *base = NULLC::GetBasePointer(target))
	{
		markerType *marker = (markerType*)((char*)base - sizeof(markerType));

		printf("%p [base %p, ", target, base);
		nullcPrintPointerMarkerInfo(*marker);
		printf("]\n");
	}
	else
	{
		printf("%p\n", target);
	}

	nullcPrintDepthIndent(indentDepth);
	printf("int len = %u\n", arr->len);
}